

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statements.cpp
# Opt level: O3

void __thiscall
hsql::PrepareStatement::setPlaceholders
          (PrepareStatement *this,vector<void_*,_std::allocator<void_*>_> *ph)

{
  pointer *pppEVar1;
  pointer ppvVar2;
  Expr *pEVar3;
  iterator __position;
  pointer ppEVar4;
  Expr *pEVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  pointer ppEVar9;
  pointer ppvVar10;
  __normal_iterator<hsql::Expr_**,_std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>_> __i;
  pointer ppEVar11;
  Expr *local_30;
  
  ppvVar10 = (ph->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppvVar2 = (ph->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppvVar10 != ppvVar2) {
    do {
      pEVar3 = (Expr *)*ppvVar10;
      if (pEVar3 != (Expr *)0x0) {
        __position._M_current =
             (this->placeholders).super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_30 = pEVar3;
        if (__position._M_current ==
            (this->placeholders).super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<hsql::Expr*,std::allocator<hsql::Expr*>>::_M_realloc_insert<hsql::Expr*>
                    ((vector<hsql::Expr*,std::allocator<hsql::Expr*>> *)&this->placeholders,
                     __position,&local_30);
        }
        else {
          *__position._M_current = pEVar3;
          pppEVar1 = &(this->placeholders).
                      super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
      }
      ppvVar10 = ppvVar10 + 1;
    } while (ppvVar10 != ppvVar2);
  }
  ppEVar9 = (this->placeholders).super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar4 = (this->placeholders).super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar9 != ppEVar4) {
    uVar6 = (long)ppEVar4 - (long)ppEVar9 >> 3;
    lVar7 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<hsql::Expr**,std::vector<hsql::Expr*,std::allocator<hsql::Expr*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<hsql::PrepareStatement::setPlaceholders(std::vector<void*,std::allocator<void*>>)::__0>>
              (ppEVar9,ppEVar4,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppEVar4 - (long)ppEVar9 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<hsql::Expr**,std::vector<hsql::Expr*,std::allocator<hsql::Expr*>>>,__gnu_cxx::__ops::_Iter_comp_iter<hsql::PrepareStatement::setPlaceholders(std::vector<void*,std::allocator<void*>>)::__0>>
                (ppEVar9,ppEVar4);
    }
    else {
      ppEVar11 = ppEVar9 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<hsql::Expr**,std::vector<hsql::Expr*,std::allocator<hsql::Expr*>>>,__gnu_cxx::__ops::_Iter_comp_iter<hsql::PrepareStatement::setPlaceholders(std::vector<void*,std::allocator<void*>>)::__0>>
                (ppEVar9,ppEVar11);
      for (; ppEVar11 != ppEVar4; ppEVar11 = ppEVar11 + 1) {
        pEVar3 = ppEVar11[-1];
        pEVar5 = *ppEVar11;
        lVar7 = pEVar5->ival;
        lVar8 = pEVar3->ival;
        ppEVar9 = ppEVar11;
        while (lVar7 < lVar8) {
          *ppEVar9 = pEVar3;
          pEVar3 = ppEVar9[-2];
          ppEVar9 = ppEVar9 + -1;
          lVar8 = pEVar3->ival;
        }
        *ppEVar9 = pEVar5;
      }
    }
  }
  ppEVar9 = (this->placeholders).super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(this->placeholders).super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar9;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    lVar8 = 0;
    do {
      ppEVar9[lVar8]->ival = lVar8;
      lVar8 = lVar8 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
  }
  return;
}

Assistant:

void PrepareStatement::setPlaceholders(std::vector<void*> ph) {
    for (void* e : ph) {
      if (e != NULL)
        placeholders.push_back((Expr*) e);
    }
    // Sort by col-id
    std::sort(placeholders.begin(), placeholders.end(), [](Expr * i, Expr * j) -> bool { return (i->ival < j->ival); });

    // Set the placeholder id on the Expr. This replaces the previously stored column id
    for (uintmax_t i = 0; i < placeholders.size(); ++i) placeholders[i]->ival = i;
  }